

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsSetPromiseContinuationCallback
          (JsPromiseContinuationCallback promiseContinuationCallback,void *callbackState)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  JsErrorCode JVar3;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  pJVar2 = JsrtContext::GetCurrent();
  JVar3 = JsErrorNoCurrentContext;
  if (pJVar2 != (JsrtContext *)0x0) {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    Js::JavascriptLibrary::SetNativeHostPromiseContinuationFunction
              ((pSVar1->super_ScriptContextBase).javascriptLibrary,
               (PromiseContinuationCallback)promiseContinuationCallback,callbackState);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    JVar3 = JsNoError;
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsSetPromiseContinuationCallback(_In_opt_ JsPromiseContinuationCallback promiseContinuationCallback, _In_opt_ void *callbackState)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        scriptContext->GetLibrary()->SetNativeHostPromiseContinuationFunction((Js::JavascriptLibrary::PromiseContinuationCallback)promiseContinuationCallback, callbackState);
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}